

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionDispatcher.cpp
# Opt level: O0

void btCollisionDispatcher::defaultNearCallback
               (btBroadphasePair *collisionPair,btCollisionDispatcher *dispatcher,
               btDispatcherInfo *dispatchInfo)

{
  btCollisionObject *collisionObject;
  ulong uVar1;
  btCollisionObjectWrapper *body0Wrap;
  btTransform *pbVar2;
  btCollisionShape *shape;
  undefined8 uVar3;
  long in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  float fVar4;
  btScalar toi;
  btManifoldResult contactPointResult;
  btCollisionObjectWrapper obj1Wrap;
  btCollisionObjectWrapper obj0Wrap;
  btCollisionObject *colObj1;
  btCollisionObject *colObj0;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  btCollisionObject *collisionObject_00;
  undefined1 local_a8 [48];
  btCollisionObjectWrapper local_78;
  btCollisionObjectWrapper local_50;
  btCollisionObject *local_28;
  btCollisionObject *local_20;
  long local_18;
  long *local_10;
  undefined8 *local_8;
  
  local_20 = *(btCollisionObject **)*in_RDI;
  local_28 = *(btCollisionObject **)in_RDI[1];
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar1 = (**(code **)(*in_RSI + 0x30))(in_RSI,local_20,local_28);
  if ((uVar1 & 1) != 0) {
    body0Wrap = (btCollisionObjectWrapper *)btCollisionObject::getCollisionShape(local_20);
    collisionObject_00 = local_20;
    pbVar2 = btCollisionObject::getWorldTransform(local_20);
    btCollisionObjectWrapper::btCollisionObjectWrapper
              (&local_50,(btCollisionObjectWrapper *)0x0,(btCollisionShape *)body0Wrap,
               collisionObject_00,pbVar2,-1,-1);
    shape = btCollisionObject::getCollisionShape(local_28);
    collisionObject = local_28;
    pbVar2 = btCollisionObject::getWorldTransform(local_28);
    btCollisionObjectWrapper::btCollisionObjectWrapper
              (&local_78,(btCollisionObjectWrapper *)0x0,shape,collisionObject,pbVar2,-1,-1);
    if (local_8[2] == 0) {
      uVar3 = (**(code **)(*local_10 + 0x10))(local_10,&local_50,&local_78,0);
      local_8[2] = uVar3;
    }
    if (local_8[2] != 0) {
      btManifoldResult::btManifoldResult
                ((btManifoldResult *)collisionObject_00,body0Wrap,
                 (btCollisionObjectWrapper *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (*(int *)(local_18 + 8) == 1) {
        (**(code **)(*(long *)local_8[2] + 0x10))
                  ((long *)local_8[2],&local_50,&local_78,local_18,local_a8);
      }
      else {
        fVar4 = (float)(**(code **)(*(long *)local_8[2] + 0x18))
                                 ((long *)local_8[2],local_20,local_28,local_18,local_a8);
        if (fVar4 < *(float *)(local_18 + 0xc)) {
          *(float *)(local_18 + 0xc) = fVar4;
        }
      }
      btManifoldResult::~btManifoldResult((btManifoldResult *)0x17875d);
    }
  }
  return;
}

Assistant:

void btCollisionDispatcher::defaultNearCallback(btBroadphasePair& collisionPair, btCollisionDispatcher& dispatcher, const btDispatcherInfo& dispatchInfo)
{
		btCollisionObject* colObj0 = (btCollisionObject*)collisionPair.m_pProxy0->m_clientObject;
		btCollisionObject* colObj1 = (btCollisionObject*)collisionPair.m_pProxy1->m_clientObject;

		if (dispatcher.needsCollision(colObj0,colObj1))
		{
			btCollisionObjectWrapper obj0Wrap(0,colObj0->getCollisionShape(),colObj0,colObj0->getWorldTransform(),-1,-1);
			btCollisionObjectWrapper obj1Wrap(0,colObj1->getCollisionShape(),colObj1,colObj1->getWorldTransform(),-1,-1);


			//dispatcher will keep algorithms persistent in the collision pair
			if (!collisionPair.m_algorithm)
			{
				collisionPair.m_algorithm = dispatcher.findAlgorithm(&obj0Wrap,&obj1Wrap);
			}

			if (collisionPair.m_algorithm)
			{
				btManifoldResult contactPointResult(&obj0Wrap,&obj1Wrap);
				
				if (dispatchInfo.m_dispatchFunc == 		btDispatcherInfo::DISPATCH_DISCRETE)
				{
					//discrete collision detection query
					
					collisionPair.m_algorithm->processCollision(&obj0Wrap,&obj1Wrap,dispatchInfo,&contactPointResult);
				} else
				{
					//continuous collision detection query, time of impact (toi)
					btScalar toi = collisionPair.m_algorithm->calculateTimeOfImpact(colObj0,colObj1,dispatchInfo,&contactPointResult);
					if (dispatchInfo.m_timeOfImpact > toi)
						dispatchInfo.m_timeOfImpact = toi;

				}
			}
		}

}